

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_zip_trn(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t destidx;
  uint32_t srcidx;
  uint32_t srcidx_00;
  MemOp memop;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TCGv_i64 tcg_src;
  TCGv_i64 tcg_src_00;
  TCGv_i64 arg;
  bool bVar7;
  int base;
  int midpoint;
  TCGv_i64 tcg_resh;
  TCGv_i64 tcg_resl;
  TCGv_i64 tcg_res;
  int elements;
  int datasize;
  int ofs;
  int i;
  int esize;
  _Bool is_q;
  _Bool part;
  int opcode;
  int size;
  int rm;
  int rn;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  destidx = extract32(insn,0,5);
  srcidx = extract32(insn,5,5);
  srcidx_00 = extract32(insn,0x10,5);
  memop = extract32(insn,0x16,2);
  uVar2 = extract32(insn,0xc,2);
  uVar3 = extract32(insn,0xe,1);
  bVar7 = uVar3 != 0;
  uVar3 = extract32(insn,0x1e,1);
  iVar4 = 8 << ((byte)memop & 0x1f);
  iVar5 = 0x40;
  if (uVar3 != 0) {
    iVar5 = 0x80;
  }
  iVar5 = iVar5 / iVar4;
  if ((uVar2 == 0) || ((memop == MO_64 && (uVar3 == 0)))) {
    unallocated_encoding_aarch64(s);
  }
  else {
    _Var1 = fp_access_check(s);
    if (_Var1) {
      tcg_src = tcg_const_i64_aarch64(tcg_ctx_00,0);
      tcg_src_00 = tcg_const_i64_aarch64(tcg_ctx_00,0);
      arg = tcg_temp_new_i64(tcg_ctx_00);
      for (datasize = 0; datasize < iVar5; datasize = datasize + 1) {
        if (uVar2 == 1) {
          if (datasize < iVar5 / 2) {
            read_vec_element(s,arg,srcidx,datasize * 2 + (uint)bVar7,memop);
          }
          else {
            read_vec_element(s,arg,srcidx_00,(datasize - iVar5 / 2) * 2 + (uint)bVar7,memop);
          }
        }
        else if (uVar2 == 2) {
          if ((datasize & 1U) == 0) {
            read_vec_element(s,arg,srcidx,(datasize & 0xfffffffeU) + (uint)bVar7,memop);
          }
          else {
            read_vec_element(s,arg,srcidx_00,(datasize & 0xfffffffeU) + (uint)bVar7,memop);
          }
        }
        else {
          if (uVar2 != 3) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x1ccf,(char *)0x0);
          }
          iVar6 = (int)((uint)bVar7 * iVar5) / 2;
          if ((datasize & 1U) == 0) {
            read_vec_element(s,arg,srcidx,iVar6 + (datasize >> 1),memop);
          }
          else {
            read_vec_element(s,arg,srcidx_00,iVar6 + (datasize >> 1),memop);
          }
        }
        iVar6 = datasize * iVar4;
        if (iVar6 < 0x40) {
          tcg_gen_shli_i64_aarch64(tcg_ctx_00,arg,arg,(long)iVar6);
          tcg_gen_or_i64_aarch64(tcg_ctx_00,tcg_src,tcg_src,arg);
        }
        else {
          tcg_gen_shli_i64_aarch64(tcg_ctx_00,arg,arg,(long)(iVar6 + -0x40));
          tcg_gen_or_i64_aarch64(tcg_ctx_00,tcg_src_00,tcg_src_00,arg);
        }
      }
      tcg_temp_free_i64(tcg_ctx_00,arg);
      write_vec_element(s,tcg_src,destidx,0,MO_64);
      tcg_temp_free_i64(tcg_ctx_00,tcg_src);
      write_vec_element(s,tcg_src_00,destidx,1,MO_64);
      tcg_temp_free_i64(tcg_ctx_00,tcg_src_00);
      clear_vec_high(s,true,destidx);
    }
  }
  return;
}

Assistant:

static void disas_simd_zip_trn(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int rm = extract32(insn, 16, 5);
    int size = extract32(insn, 22, 2);
    /* opc field bits [1:0] indicate ZIP/UZP/TRN;
     * bit 2 indicates 1 vs 2 variant of the insn.
     */
    int opcode = extract32(insn, 12, 2);
    bool part = extract32(insn, 14, 1);
    bool is_q = extract32(insn, 30, 1);
    int esize = 8 << size;
    int i, ofs;
    int datasize = is_q ? 128 : 64;
    int elements = datasize / esize;
    TCGv_i64 tcg_res, tcg_resl, tcg_resh;

    if (opcode == 0 || (size == 3 && !is_q)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_resl = tcg_const_i64(tcg_ctx, 0);
    tcg_resh = tcg_const_i64(tcg_ctx, 0);
    tcg_res = tcg_temp_new_i64(tcg_ctx);

    for (i = 0; i < elements; i++) {
        switch (opcode) {
        case 1: /* UZP1/2 */
        {
            int midpoint = elements / 2;
            if (i < midpoint) {
                read_vec_element(s, tcg_res, rn, 2 * i + part, size);
            } else {
                read_vec_element(s, tcg_res, rm,
                                 2 * (i - midpoint) + part, size);
            }
            break;
        }
        case 2: /* TRN1/2 */
            if (i & 1) {
                read_vec_element(s, tcg_res, rm, (i & ~1) + part, size);
            } else {
                read_vec_element(s, tcg_res, rn, (i & ~1) + part, size);
            }
            break;
        case 3: /* ZIP1/2 */
        {
            int base = part * elements / 2;
            if (i & 1) {
                read_vec_element(s, tcg_res, rm, base + (i >> 1), size);
            } else {
                read_vec_element(s, tcg_res, rn, base + (i >> 1), size);
            }
            break;
        }
        default:
            g_assert_not_reached();
        }

        ofs = i * esize;
        if (ofs < 64) {
            tcg_gen_shli_i64(tcg_ctx, tcg_res, tcg_res, ofs);
            tcg_gen_or_i64(tcg_ctx, tcg_resl, tcg_resl, tcg_res);
        } else {
            tcg_gen_shli_i64(tcg_ctx, tcg_res, tcg_res, ofs - 64);
            tcg_gen_or_i64(tcg_ctx, tcg_resh, tcg_resh, tcg_res);
        }
    }

    tcg_temp_free_i64(tcg_ctx, tcg_res);

    write_vec_element(s, tcg_resl, rd, 0, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resl);
    write_vec_element(s, tcg_resh, rd, 1, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resh);
    clear_vec_high(s, true, rd);
}